

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partial.c
# Opt level: O0

void partial_bndry(int type,Item *qvar,Item *qfirstlast,Item *qexpr,Item *qlast)

{
  Item *pIVar1;
  List *q1;
  long in_RDX;
  int in_EDI;
  List *l;
  Item *q;
  int indx;
  Symbol *in_stack_ffffffffffffffb8;
  List *in_stack_ffffffffffffffc0;
  int local_2c;
  
  if (bndinfo == (List *)0x0) {
    bndinfo = newlist();
  }
  local_2c = in_EDI;
  if (**(short **)(in_RDX + 8) != 0x14b) {
    local_2c = in_EDI + 1;
  }
  lappendsym(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pIVar1 = lappendsym(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  pIVar1->itemtype = (short)local_2c;
  q1 = newlist();
  (pIVar1->element).itm = q1;
  if (local_2c < 2) {
    deltokens(q1,(Item *)in_stack_ffffffffffffffb8);
  }
  else {
    deltokens(q1,(Item *)in_stack_ffffffffffffffb8);
  }
  movelist(q1,(Item *)in_stack_ffffffffffffffb8,(List *)0x10fb38);
  return;
}

Assistant:

void partial_bndry(type, qvar, qfirstlast, qexpr, qlast)
	int type;
	Item *qvar, *qfirstlast, *qexpr, *qlast;
{
	int indx;
	Item *q;
	List *l;
	
	if (!bndinfo) {
		bndinfo = newlist();
	}
	if (SYM(qfirstlast)->type == FIRST) {
		indx = type;
	}else{
		indx = type + 1;
	}
	Lappendsym(bndinfo, SYM(qvar));
	q = lappendsym(bndinfo, SYM0);
	q->itemtype = indx;
	l = newlist();
	LST(q) = l;

	if (indx < 2) { /* ~ DEL y [N] = */
		deltokens(qvar->prev->prev, qexpr->prev);
	}else{ /* ~ ... = */
		deltokens(qvar->prev, qexpr->prev);
	}
	movelist(qexpr, qlast, l);
}